

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O3

void JsrtDebugUtils::AddVarPropertyToObject
               (DynamicObject *object,char16 *propertyName,Var value,ScriptContext *scriptContext)

{
  PropertyRecord *in_RAX;
  size_t sVar1;
  Var newValue;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  
  local_38 = in_RAX;
  sVar1 = PAL_wcslen(propertyName);
  Js::ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyName,(int)sVar1,&local_38);
  newValue = Js::CrossSite::MarshalVar(scriptContext,value,false);
  Js::JavascriptOperators::InitProperty
            (&object->super_RecyclableObject,local_38->pid,newValue,PropertyOperation_None);
  return;
}

Assistant:

void JsrtDebugUtils::AddVarPropertyToObject(Js::DynamicObject * object, const char16 * propertyName, Js::Var value, Js::ScriptContext * scriptContext)
{
    const Js::PropertyRecord* propertyRecord;

    // propertyName is the DEBUGOBJECTPROPERTY from JsrtDebugPropertiesEnum so it can't have embedded null, ok to use wcslen
    scriptContext->GetOrAddPropertyRecord(propertyName, static_cast<int>(wcslen(propertyName)), &propertyRecord);

    Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, value);

    if (FALSE == Js::JavascriptOperators::InitProperty(object, propertyRecord->GetPropertyId(), marshaledObj))
    {
        Assert("Failed to add property to debugger object");
    }
}